

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *__s;
  lua_Integer lVar5;
  TValue *pTVar6;
  char *pcVar7;
  size_t __n;
  TValue *pTVar8;
  long lVar9;
  char *__s_00;
  char *__n_00;
  ulong uVar10;
  long lVar11;
  size_t l2;
  size_t l1;
  MatchState ms;
  ulong local_260;
  ulong local_258;
  MatchState local_250;
  
  pcVar4 = luaL_checklstring(L,1,&local_258);
  __s = luaL_checklstring(L,2,&local_260);
  lVar5 = luaL_optinteger(L,3,1);
  uVar10 = lVar5 >> 0x3f & local_258 + 1;
  lVar11 = uVar10 + lVar5;
  if (lVar11 == 0 || SCARRY8(uVar10,lVar5) != lVar11 < 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = lVar11 - 1;
    if (local_258 < uVar10) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
      return 1;
    }
  }
  if (find == 0) {
LAB_0014423e:
    cVar1 = *__s;
    local_250.src_end = pcVar4 + local_258;
    lVar9 = 1;
    local_250.src_init = pcVar4;
    local_250.L = L;
    if (1 < lVar11) {
      lVar9 = lVar11;
    }
    do {
      lVar11 = lVar9 + -1;
      local_250.level = 0;
      local_250.depth = 0;
      pcVar7 = match(&local_250,pcVar4 + lVar11,__s + (cVar1 == '^'));
      if (pcVar7 != (char *)0x0) {
        if (find != 0) {
          L->top->n = (double)lVar9;
          pTVar8 = L->top + 1;
          L->top = pTVar8;
          if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar8) {
            lj_state_growstack(L,1);
            pTVar8 = L->top;
          }
          pTVar8->n = (double)((long)pcVar7 - (long)pcVar4);
          pTVar8 = L->top;
          L->top = pTVar8 + 1;
          if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar8 + 1) {
            lj_state_growstack(L,1);
          }
          iVar3 = push_captures(&local_250,(char *)0x0,(char *)0x0);
          return iVar3 + 2;
        }
        iVar3 = push_captures(&local_250,pcVar4 + lVar9 + -1,pcVar7);
        return iVar3;
      }
    } while ((cVar1 != '^') && (lVar9 = lVar9 + 1, pcVar4 + lVar11 < local_250.src_end));
    pTVar8 = L->top;
  }
  else {
    pTVar8 = L->top;
    pTVar6 = L->base + 3;
    if (pTVar8 <= pTVar6) {
      pTVar6 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
    }
    if ((0xfffffffd < (pTVar6->field_2).it) &&
       (pcVar7 = strpbrk(__s,"^$*+?.([%-"), pcVar7 != (char *)0x0)) goto LAB_0014423e;
    pcVar7 = pcVar4 + uVar10;
    if (local_260 == 0) {
LAB_00144426:
      pTVar8->n = (double)(long)(pcVar7 + (1 - (long)pcVar4));
      pTVar8 = L->top + 1;
      L->top = pTVar8;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar8) {
        lj_state_growstack(L,1);
        pTVar8 = L->top;
      }
      pTVar8->n = (double)(long)(pcVar7 + (local_260 - (long)pcVar4));
      pTVar8 = L->top + 1;
      L->top = pTVar8;
      uVar2 = (L->maxstack).ptr32;
      iVar3 = 2;
      goto LAB_00144480;
    }
    if (local_260 <= local_258 - uVar10) {
      __n = local_260 - 1;
      __n_00 = (char *)((local_258 - uVar10) - __n);
      if (__n_00 != (char *)0x0) {
        cVar1 = *__s;
        __s_00 = pcVar7;
        do {
          pcVar7 = (char *)memchr(__s_00,(int)cVar1,(size_t)__n_00);
          if (pcVar7 == (char *)0x0) break;
          __s1 = pcVar7 + 1;
          iVar3 = bcmp(__s1,__s + 1,__n);
          if (iVar3 == 0) goto LAB_00144426;
          __n_00 = __s_00 + ((long)__n_00 - (long)__s1);
          __s_00 = __s1;
        } while (__n_00 != (char *)0x0);
      }
    }
  }
  (pTVar8->field_2).it = 0xffffffff;
  pTVar8 = L->top + 1;
  L->top = pTVar8;
  uVar2 = (L->maxstack).ptr32;
  iVar3 = 1;
LAB_00144480:
  if ((TValue *)(ulong)uVar2 <= pTVar8) {
    lj_state_growstack(L,1);
  }
  return iVar3;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) {
    init = 0;
  } else if ((size_t)(init) > l1) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    init = (ptrdiff_t)l1;
#endif
  }
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-(size_t)init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+(ptrdiff_t)l2);
      return 2;
    }
  } else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = ms.depth = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
	if (find) {
	  lua_pushinteger(L, s1-s+1);  /* start */
	  lua_pushinteger(L, res-s);   /* end */
	  return push_captures(&ms, NULL, 0) + 2;
	} else {
	  return push_captures(&ms, s1, res);
	}
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}